

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_realloc(void *msp,void *ptr,size_t nsize)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  size_t newtopsize;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mstate m;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (nsize < 0xffffffffffffff80) {
    puVar8 = (ulong *)((long)ptr + -0x10);
    uVar7 = *(ulong *)((long)ptr + -8);
    uVar10 = uVar7 & 0xfffffffffffffffc;
    uVar9 = 0x20;
    if (0x16 < nsize) {
      uVar9 = nsize + 0xf & 0xfffffffffffffff8;
    }
    if (((uVar7 & 1) == 0) && ((*puVar8 & 1) != 0)) {
      if (uVar9 < 0x100) {
LAB_00135bb3:
        pvVar3 = lj_alloc_malloc(msp,nsize);
        if (pvVar3 != (void *)0x0) {
          uVar7 = 0xfffffffffffffff8;
          if ((*(byte *)((long)ptr + -8) & 1) == 0) {
            uVar7 = (ulong)((*(byte *)puVar8 & 1) == 0) << 3 | 0xfffffffffffffff0;
          }
          uVar9 = uVar7 + uVar10;
          if (nsize <= uVar7 + uVar10) {
            uVar9 = nsize;
          }
          memcpy(pvVar3,ptr,uVar9);
          lj_alloc_free(msp,ptr);
          return pvVar3;
        }
        goto LAB_00135adf;
      }
      if (uVar10 < uVar9 + 8 || 0x10000 < uVar10 - uVar9) {
        uVar7 = *puVar8 & 0xfffffffffffffffe;
        uVar9 = uVar9 + 0x1036 & 0xfffffffffffff000;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        pvVar3 = mremap((void *)((long)puVar8 - uVar7),uVar7 + uVar10 + 0x20,uVar9,1);
        *piVar4 = iVar2;
        if (pvVar3 == (void *)0xffffffffffffffff) goto LAB_00135bb3;
        puVar8 = (ulong *)((long)pvVar3 + uVar7);
        *(ulong *)((long)pvVar3 + uVar7 + 8) = (uVar9 - uVar7) - 0x20 | 2;
        pbVar1 = (byte *)((uVar9 - uVar7) + -0x18 + (long)puVar8);
        pbVar1[0] = 0xb;
        pbVar1[1] = 0;
        pbVar1[2] = 0;
        pbVar1[3] = 0;
        pbVar1[4] = 0;
        pbVar1[5] = 0;
        pbVar1[6] = 0;
        pbVar1[7] = 0;
        *(undefined8 *)((long)pvVar3 + (uVar9 - 0x10)) = 0;
      }
    }
    else {
      uVar7 = (ulong)((uint)uVar7 & 1);
      if (uVar10 < uVar9) {
        if (((long)ptr + (uVar10 - 0x10) != *(long *)((long)msp + 0x20)) ||
           (uVar5 = *(long *)((long)msp + 0x10) + uVar10, uVar6 = uVar5 - uVar9,
           uVar5 < uVar9 || uVar6 == 0)) goto LAB_00135bb3;
        *(ulong *)((long)ptr + -8) = uVar7 + uVar9 + 2;
        *(ulong *)((long)ptr + (uVar9 - 8)) = uVar6 | 1;
        *(byte **)((long)msp + 0x20) = (byte *)(uVar9 + (long)puVar8);
        *(ulong *)((long)msp + 0x10) = uVar6;
      }
      else if (0x1f < uVar10 - uVar9) {
        *(ulong *)((long)ptr + -8) = uVar7 + uVar9 + 2;
        *(ulong *)((long)ptr + (uVar9 - 8)) = uVar10 - uVar9 | 3;
        pbVar1 = (byte *)((long)ptr + (uVar10 - 8));
        *pbVar1 = *pbVar1 | 1;
        lj_alloc_free(msp,(byte *)((long)puVar8 + uVar9 + 0x10));
      }
    }
    puVar8 = puVar8 + 2;
  }
  else {
LAB_00135adf:
    puVar8 = (ulong *)0x0;
  }
  return puVar8;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_realloc(void *msp, void *ptr, size_t nsize)
{
  if (nsize >= MAX_REQUEST) {
    return NULL;
  } else {
    mstate m = (mstate)msp;
    mchunkptr oldp = mem2chunk(ptr);
    size_t oldsize = chunksize(oldp);
    mchunkptr next = chunk_plus_offset(oldp, oldsize);
    mchunkptr newp = 0;
    size_t nb = request2size(nsize);

    /* Try to either shrink or extend into top. Else malloc-copy-free */
    if (is_direct(oldp)) {
      newp = direct_resize(oldp, nb);  /* this may return NULL. */
    } else if (oldsize >= nb) { /* already big enough */
      size_t rsize = oldsize - nb;
      newp = oldp;
      if (rsize >= MIN_CHUNK_SIZE) {
	mchunkptr rem = chunk_plus_offset(newp, nb);
	set_inuse(m, newp, nb);
	set_inuse(m, rem, rsize);
	lj_alloc_free(m, chunk2mem(rem));
      }
    } else if (next == m->top && oldsize + m->topsize > nb) {
      /* Expand into top */
      size_t newsize = oldsize + m->topsize;
      size_t newtopsize = newsize - nb;
      mchunkptr newtop = chunk_plus_offset(oldp, nb);
      set_inuse(m, oldp, nb);
      newtop->head = newtopsize |PINUSE_BIT;
      m->top = newtop;
      m->topsize = newtopsize;
      newp = oldp;
    }

    if (newp != 0) {
      return chunk2mem(newp);
    } else {
      void *newmem = lj_alloc_malloc(m, nsize);
      if (newmem != 0) {
	size_t oc = oldsize - overhead_for(oldp);
	memcpy(newmem, ptr, oc < nsize ? oc : nsize);
	lj_alloc_free(m, ptr);
      }
      return newmem;
    }
  }
}